

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  undefined8 *puVar1;
  long lVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  size_t checkpoint;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar9;
  void *pvVar10;
  ulong uVar11;
  secp256k1_gej *b;
  uint uVar12;
  long lVar13;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar14;
  int *piVar15;
  secp256k1_ge *psVar16;
  long lVar17;
  uint uVar18;
  secp256k1_scalar *s1_00;
  long lVar19;
  long lVar20;
  bool bVar21;
  byte bVar22;
  int local_12c;
  long local_128;
  secp256k1_gej running_sum;
  
  bVar22 = 0;
  checkpoint = secp256k1_scratch_checkpoint(error_callback,scratch);
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  if (inp_g_sc == (secp256k1_scalar *)0x0 && n_points == 0) {
    local_12c = 1;
  }
  else {
    lVar13 = n_points * 2 + 2;
    uVar7 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar13 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar13 * 0x20);
    plVar9 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    local_12c = 0;
    if ((plVar9 != (long *)0x0 && s1 != (secp256k1_scalar *)0x0) && p1 != (secp256k1_ge *)0x0) {
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar13 * 0x10);
      plVar9[1] = (long)pvVar10;
      bVar6 = 0x7f / (byte)(uVar7 + 1);
      uVar12 = (uint)bVar6;
      uVar11 = (ulong)(bVar6 + 1);
      pvVar10 = secp256k1_scratch_alloc(error_callback,scratch,lVar13 * uVar11 * 4);
      *plVar9 = (long)pvVar10;
      b = (secp256k1_gej *)
          secp256k1_scratch_alloc(error_callback,scratch,0x80L << ((byte)uVar7 & 0x3f));
      if ((plVar9[1] != 0) && (b != (secp256k1_gej *)0x0 && *plVar9 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar13 = 0;
        }
        else {
          uVar3 = inp_g_sc->d[0];
          uVar4 = inp_g_sc->d[1];
          uVar5 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar5;
          s1->d[0] = uVar3;
          s1->d[1] = uVar4;
          psVar14 = &secp256k1_ge_const_g;
          psVar16 = p1;
          for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
            (psVar16->x).n[0] = (psVar14->x).n[0];
            psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar22 * -2 + 1) * 8);
            psVar16 = (secp256k1_ge *)((long)psVar16 + (ulong)bVar22 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar13 = 2;
        }
        s1_00 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar13 << 5));
        psVar14 = p1 + lVar13;
        while (bVar21 = n_points != 0, n_points = n_points - 1, bVar21) {
          iVar8 = (*cb)(s1_00,psVar14,cb_offset,cbdata);
          if (iVar8 == 0) {
            local_12c = 0;
            goto LAB_0013290a;
          }
          secp256k1_ecmult_endo_split(s1_00,s1_00 + 1,psVar14,psVar14 + 1);
          lVar13 = lVar13 + 2;
          s1_00 = s1_00 + 2;
          psVar14 = psVar14 + 2;
          cb_offset = cb_offset + 1;
        }
        piVar15 = &p1->infinity;
        local_128 = 0;
        for (lVar19 = 0; lVar13 != lVar19; lVar19 = lVar19 + 1) {
          iVar8 = secp256k1_scalar_is_zero(s1);
          if ((iVar8 == 0) && (*piVar15 == 0)) {
            *(long *)(plVar9[1] + 8 + local_128 * 0x10) = lVar19;
            iVar8 = secp256k1_wnaf_fixed((int *)(local_128 * uVar11 * 4 + *plVar9),s1,uVar7 + 1);
            *(int *)(plVar9[1] + local_128 * 0x10) = iVar8;
            local_128 = local_128 + 1;
          }
          piVar15 = piVar15 + 0x16;
          s1 = s1 + 1;
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        (r->x).n[4] = 0;
        (r->y).n[0] = 0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        local_12c = 1;
        if (local_128 != 0) {
          lVar13 = 1L << ((byte)uVar7 & 0x3f);
          for (; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
            for (lVar19 = 0; lVar13 << 7 != lVar19; lVar19 = lVar19 + 0x80) {
              *(undefined4 *)((long)(&b->z + 1) + lVar19) = 1;
              puVar1 = (undefined8 *)((long)(b->x).n + lVar19);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->x).n + lVar19 + 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->x).n + lVar19 + 0x20);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->y).n + lVar19 + 8);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->y).n + lVar19 + 0x18);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->z).n + lVar19);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)(b->z).n + lVar19 + 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)(b->z).n + lVar19 + 0x20) = 0;
            }
            lVar17 = (ulong)uVar12 << 2;
            lVar19 = 8;
            lVar20 = local_128;
            while (bVar21 = lVar20 != 0, lVar20 = lVar20 + -1, bVar21) {
              uVar18 = *(uint *)(*plVar9 + lVar17);
              lVar2 = *(long *)(plVar9[1] + lVar19);
              if ((uVar12 == 0) && (*(int *)(plVar9[1] + -8 + lVar19) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)&running_sum,p1 + lVar2);
                secp256k1_gej_add_ge_var(b,b,(secp256k1_ge *)&running_sum,(secp256k1_fe *)0x0);
              }
              if ((int)uVar18 < 1) {
                if ((int)uVar18 < 0) {
                  uVar18 = ~uVar18;
                  r_00 = &running_sum;
                  secp256k1_ge_neg((secp256k1_ge *)r_00,p1 + lVar2);
                  goto LAB_001327b1;
                }
              }
              else {
                uVar18 = uVar18 - 1;
                r_00 = (secp256k1_gej *)(p1 + lVar2);
LAB_001327b1:
                secp256k1_gej_add_ge_var
                          (b + (uVar18 >> 1),b + (uVar18 >> 1),(secp256k1_ge *)r_00,
                           (secp256k1_fe *)0x0);
              }
              lVar19 = lVar19 + 0x10;
              lVar17 = lVar17 + (0x7f / ((ulong)uVar7 + 1)) * 4 + 4;
            }
            uVar18 = uVar7;
            while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
              secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            }
            running_sum.infinity = 1;
            running_sum.x.n[0] = 0;
            running_sum.x.n[1] = 0;
            running_sum.x.n[2] = 0;
            running_sum.x.n[3] = 0;
            running_sum.x.n[4] = 0;
            running_sum.y.n[0] = 0;
            running_sum.y.n[1] = 0;
            running_sum.y.n[2] = 0;
            running_sum.y.n[3] = 0;
            running_sum.y.n[4] = 0;
            running_sum.z.n[0] = 0;
            running_sum.z.n[1] = 0;
            running_sum.z.n[2] = 0;
            running_sum.z.n[3] = 0;
            running_sum.z.n[4] = 0;
            lVar19 = lVar13;
            while (1 < lVar19) {
              lVar19 = lVar19 + -1;
              secp256k1_gej_add_var
                        (&running_sum,&running_sum,b + ((uint)lVar19 & 0x7fffffff),
                         (secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
            }
            secp256k1_gej_add_var(&running_sum,&running_sum,b,(secp256k1_fe *)0x0);
            secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
            secp256k1_gej_add_var(r,r,&running_sum,(secp256k1_fe *)0x0);
          }
        }
      }
    }
LAB_0013290a:
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  }
  return local_12c;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}